

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_wrapper.h
# Opt level: O2

void __thiscall MeCab::ostream_wrapper::ostream_wrapper(ostream_wrapper *this,char *filename)

{
  ostream *this_00;
  
  this->_vptr_ostream_wrapper = (_func_int **)&PTR__ostream_wrapper_0019ec68;
  this->os_ = (ostream *)0x0;
  if ((*filename == '-') && (filename[1] == '\0')) {
    this_00 = (ostream *)&std::cout;
  }
  else {
    this_00 = (ostream *)operator_new(0x200);
    std::ofstream::ofstream(this_00,filename,_S_out);
  }
  this->os_ = this_00;
  return;
}

Assistant:

explicit ostream_wrapper(const char* filename): os_(0) {
    if (std::strcmp(filename, "-") == 0) {
      os_ = &std::cout;
    } else {
      os_ = new std::ofstream(WPATH(filename));
    }
  }